

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  
  if (curr[0x38] == (CallRef)0x1) {
    pEVar1 = this->parent;
    pEVar1->branchesOut = true;
    if (((pEVar1->features).features & 0x40) != 0) {
      pEVar1->hasReturnCallThrow = true;
    }
  }
  bVar2 = Type::isNull((Type *)(*(long *)(curr + 0x30) + 8));
  if (bVar2) {
    this->parent->trap = true;
  }
  else {
    if (((uint)*(ulong *)(*(long *)(curr + 0x30) + 8) & 3) == 2 &&
        6 < *(ulong *)(*(long *)(curr + 0x30) + 8)) {
      this->parent->implicitTrap = true;
    }
    pEVar1 = this->parent;
    pEVar1->calls = true;
    if (((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) &&
       (curr[0x38] == (CallRef)0x0)) {
      pEVar1->throws_ = true;
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->isReturn) {
        parent.branchesOut = true;
        if (parent.features.hasExceptionHandling()) {
          parent.hasReturnCallThrow = true;
        }
      }
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }

      parent.calls = true;
      if (parent.features.hasExceptionHandling() &&
          (parent.tryDepth == 0 && !curr->isReturn)) {
        parent.throws_ = true;
      }
    }